

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

char * __thiscall
tinyxml2::XMLAttribute::ParseDeep
          (XMLAttribute *this,char *p,bool processEntities,int *curLineNumPtr)

{
  char *pcVar1;
  int strFlags;
  char local_32 [2];
  int *piStack_30;
  char endTag [2];
  int *curLineNumPtr_local;
  bool processEntities_local;
  char *p_local;
  XMLAttribute *this_local;
  
  piStack_30 = curLineNumPtr;
  pcVar1 = StrPair::ParseName(&this->_name,p);
  if ((pcVar1 == (char *)0x0) || (*pcVar1 == '\0')) {
    this_local = (XMLAttribute *)0x0;
  }
  else {
    pcVar1 = XMLUtil::SkipWhiteSpace(pcVar1,piStack_30);
    if (*pcVar1 == '=') {
      pcVar1 = XMLUtil::SkipWhiteSpace(pcVar1 + 1,piStack_30);
      if ((*pcVar1 == '\"') || (*pcVar1 == '\'')) {
        local_32[0] = *pcVar1;
        local_32[1] = 0;
        strFlags = 2;
        if (processEntities) {
          strFlags = 3;
        }
        this_local = (XMLAttribute *)
                     StrPair::ParseText(&this->_value,pcVar1 + 1,local_32,strFlags,piStack_30);
      }
      else {
        this_local = (XMLAttribute *)0x0;
      }
    }
    else {
      this_local = (XMLAttribute *)0x0;
    }
  }
  return (char *)this_local;
}

Assistant:

char* XMLAttribute::ParseDeep( char* p, bool processEntities, int* curLineNumPtr )
{
    // Parse using the name rules: bug fix, was using ParseText before
    p = _name.ParseName( p );
    if ( !p || !*p ) {
        return 0;
    }

    // Skip white space before =
    p = XMLUtil::SkipWhiteSpace( p, curLineNumPtr );
    if ( *p != '=' ) {
        return 0;
    }

    ++p;	// move up to opening quote
    p = XMLUtil::SkipWhiteSpace( p, curLineNumPtr );
    if ( *p != '\"' && *p != '\'' ) {
        return 0;
    }

    const char endTag[2] = { *p, 0 };
    ++p;	// move past opening quote

    p = _value.ParseText( p, endTag, processEntities ? StrPair::ATTRIBUTE_VALUE : StrPair::ATTRIBUTE_VALUE_LEAVE_ENTITIES, curLineNumPtr );
    return p;
}